

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall detail::reader::operator()(reader *this,string *val)

{
  ushort uVar1;
  ushort *puVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar2 = (ushort *)(this->buf_).data_;
  uVar5 = (this->buf_).size_;
  uVar1 = *puVar2;
  uVar3 = 2;
  if (uVar5 < 2) {
    uVar3 = uVar5;
  }
  pvVar4 = (void *)((long)puVar2 + uVar3);
  (this->buf_).data_ = pvVar4;
  (this->buf_).size_ = uVar5 - uVar3;
  uVar5 = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pvVar4,(long)pvVar4 + uVar5);
  std::__cxx11::string::operator=((string *)val,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  uVar3 = (this->buf_).size_;
  if (uVar3 < uVar5) {
    uVar5 = uVar3;
  }
  (this->buf_).data_ = (void *)((long)(this->buf_).data_ + uVar5);
  (this->buf_).size_ = uVar3 - uVar5;
  return;
}

Assistant:

void operator()(std::string& val) const {
        uint16_t length = 0;
        (*this)(length);
        val = std::string(asio::buffer_cast<char const*>(buf_), length);
        buf_ = buf_ + length;
    }